

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::StencilCase::executeOps
          (StencilCase *this,Context *context,IVec4 *cell,
          vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
          *ops)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  StencilOp *op;
  pointer pSVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar14;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  int local_78;
  int iStack_70;
  int iStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  Vec4 local_58;
  StencilCase *local_48;
  Vec3 local_40;
  
  local_78 = (int)*(undefined8 *)cell->m_data;
  iStack_70 = (int)*(undefined8 *)(cell->m_data + 2);
  iStack_6c = (int)((ulong)*(undefined8 *)(cell->m_data + 2) >> 0x20);
  iVar2 = (*context->_vptr_Context[2])(context);
  iVar4 = cell->m_data[1];
  iVar3 = (*context->_vptr_Context[3])(context);
  auVar9._0_4_ = (float)iVar2;
  auVar9._4_4_ = (float)iVar3;
  auVar9._8_8_ = 0;
  auVar13._4_4_ = (float)iVar4;
  auVar13._0_4_ = (float)local_78;
  auVar13._8_4_ = (float)iStack_70;
  auVar13._12_4_ = (float)iStack_6c;
  auVar13 = divps(auVar13,auVar9);
  fVar11 = auVar13._0_4_ + auVar13._0_4_ + -1.0;
  fVar14 = auVar13._4_4_ + auVar13._4_4_ + -1.0;
  uVar12 = *(undefined8 *)(cell->m_data + 2);
  iVar4 = (*context->_vptr_Context[2])(context);
  fStack_60 = (float)uVar12;
  fStack_5c = (float)((ulong)uVar12 >> 0x20);
  local_68._4_4_ = (float)cell->m_data[3];
  local_68._0_4_ = (float)(int)fStack_60;
  fStack_60 = (float)(int)fStack_60;
  fStack_5c = (float)(int)fStack_5c;
  iVar2 = (*context->_vptr_Context[3])(context);
  auVar10._0_4_ = (float)iVar4;
  auVar10._4_4_ = (float)iVar2;
  auVar10._8_8_ = 0;
  auVar13 = divps(_local_68,auVar10);
  uVar12._0_4_ = auVar13._0_4_ + auVar13._0_4_ + fVar11;
  uVar12._4_4_ = auVar13._4_4_ + auVar13._4_4_ + fVar14;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_48 = this;
  StencilShader::setColor(&this->m_shader,context,this->m_shaderID,&local_58);
  pSVar7 = (ops->
           super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar7 == (ops->
                  super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    TVar1 = pSVar7->type;
    if (TVar1 == TYPE_CLEAR_STENCIL) {
      (*context->_vptr_Context[0x33])(context,0xc11);
      (*context->_vptr_Context[0x32])
                (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                 (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
      (*context->_vptr_Context[0x2c])(context,(ulong)(uint)pSVar7->stencil);
      uVar8 = 0x400;
LAB_00e9e139:
      uVar6 = 0xc11;
      lVar5 = 0x168;
LAB_00e9e13e:
      (**(code **)((long)context->_vptr_Context + lVar5))(context,uVar8);
      (*context->_vptr_Context[0x34])(context,(ulong)uVar6);
    }
    else {
      if (TVar1 == TYPE_QUAD) {
        uVar6 = 0xb71;
        (*context->_vptr_Context[0x33])(context,0xb71);
        uVar8 = 0xb90;
        (*context->_vptr_Context[0x33])(context,0xb90);
        (*context->_vptr_Context[0x39])(context,(ulong)pSVar7->depthTest);
        (*context->_vptr_Context[0x35])
                  (context,(ulong)pSVar7->stencilTest,(ulong)(uint)pSVar7->stencil,
                   (ulong)pSVar7->stencilMask);
        (*context->_vptr_Context[0x36])
                  (context,(ulong)pSVar7->sFail,(ulong)pSVar7->dFail,(ulong)pSVar7->dPass);
        local_40.m_data[2] = pSVar7->depth;
        local_58.m_data[1] = fVar14;
        local_58.m_data[0] = fVar11;
        local_58.m_data[2] = local_40.m_data[2];
        local_40.m_data._0_8_ = uVar12;
        sglr::drawQuad(context,local_48->m_shaderID,(Vec3 *)&local_58,&local_40);
        lVar5 = 0x1a0;
        goto LAB_00e9e13e;
      }
      if (TVar1 == TYPE_CLEAR_DEPTH) {
        (*context->_vptr_Context[0x33])(context,0xc11);
        (*context->_vptr_Context[0x32])
                  (context,(ulong)(uint)cell->m_data[0],(ulong)(uint)cell->m_data[1],
                   (ulong)(uint)cell->m_data[2],(ulong)(uint)cell->m_data[3]);
        (*context->_vptr_Context[0x2b])(context);
        uVar8 = 0x100;
        goto LAB_00e9e139;
      }
    }
    pSVar7 = pSVar7 + 1;
  } while( true );
}

Assistant:

void StencilCase::executeOps (sglr::Context& context, const IVec4& cell, const vector<StencilOp>& ops)
{
	// For quadOps
	float x0 = 2.0f*((float)cell.x() / (float)context.getWidth())-1.0f;
	float y0 = 2.0f*((float)cell.y() / (float)context.getHeight())-1.0f;
	float x1 = x0 + 2.0f*((float)cell.z() / (float)context.getWidth());
	float y1 = y0 + 2.0f*((float)cell.w() / (float)context.getHeight());

	m_shader.setColor(context, m_shaderID, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (vector<StencilOp>::const_iterator i = ops.begin(); i != ops.end(); i++)
	{
		const StencilOp& op = *i;

		switch (op.type)
		{
			case StencilOp::TYPE_CLEAR_DEPTH:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearDepthf(op.depth);
				context.clear(GL_DEPTH_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_CLEAR_STENCIL:
				context.enable(GL_SCISSOR_TEST);
				context.scissor(cell.x(), cell.y(), cell.z(), cell.w());
				context.clearStencil(op.stencil);
				context.clear(GL_STENCIL_BUFFER_BIT);
				context.disable(GL_SCISSOR_TEST);
				break;

			case StencilOp::TYPE_QUAD:
				context.enable(GL_DEPTH_TEST);
				context.enable(GL_STENCIL_TEST);
				context.depthFunc(op.depthTest);
				context.stencilFunc(op.stencilTest, op.stencil, op.stencilMask);
				context.stencilOp(op.sFail, op.dFail, op.dPass);
				sglr::drawQuad(context, m_shaderID, Vec3(x0, y0, op.depth), Vec3(x1, y1, op.depth));
				context.disable(GL_STENCIL_TEST);
				context.disable(GL_DEPTH_TEST);
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}